

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PPrintTag(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  byte *pbVar1;
  TidyPrintImpl *pprint_00;
  uint uVar2;
  Node *attr;
  Lexer *pLVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  Bool BVar7;
  int iVar8;
  AttVal *pAVar9;
  char *node_00;
  uint indent_00;
  TidyPrintImpl *pprint;
  byte *str;
  tchar c;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  pprint_00 = &doc->pprint;
  iVar8 = *(int *)((doc->config).value + 0x55);
  local_38 = (ulong)*(uint *)((doc->config).value + 0x62);
  local_40 = (ulong)*(uint *)((doc->config).value + 100);
  str = (byte *)node->element;
  node_00 = (char *)node;
  local_44 = mode;
  AddChar(pprint_00,0x3c);
  if (node->type == EndTag) {
    AddChar(pprint_00,0x2f);
  }
  if (str != (byte *)0x0) {
    bVar5 = *str;
    while (bVar5 != 0) {
      local_48 = (uint)bVar5;
      if ((char)bVar5 < '\0') {
        uVar6 = prvTidyGetUTF8((ctmbstr)str,&local_48);
        str = str + uVar6;
      }
      else if (iVar8 != 0) {
        local_48 = prvTidyToUpper(local_48);
      }
      AddChar(pprint_00,local_48);
      pbVar1 = str + 1;
      str = str + 1;
      bVar5 = *pbVar1;
    }
  }
  if ((((*(int *)((doc->config).value + 100) != 0) && (*(int *)((doc->config).value + 0x66) != 0))
      && (pAVar9 = prvTidyGetAttrByName(node,"xml:space"), pAVar9 == (AttVal *)0x0)) &&
     (BVar7 = prvTidyXMLPreserveWhiteSpace(doc,node), BVar7 != no)) {
    node_00 = "preserve";
    prvTidyAddAttribute(doc,node,"xml:space","preserve");
  }
  uVar4 = local_38;
  for (attr = (Node *)node->attributes; attr != (Node *)0x0; attr = attr->parent) {
    if (attr->attributes == (AttVal *)0x0) {
      if (attr->next == (Node *)0x0) {
        if (attr->content != (Node *)0x0) {
          AddChar(pprint_00,0x20);
          PPrintPhp(doc,indent,attr->content);
        }
      }
      else {
        AddChar(pprint_00,0x20);
        PPrintAsp(doc,indent,attr->next);
      }
    }
    else {
      node_00 = (char *)attr;
      PPrintAttribute(doc,indent,node,(AttVal *)attr);
    }
  }
  local_40 = local_40 | uVar4;
  if ((local_40 != 0) &&
     ((node->type == StartEndTag || (BVar7 = prvTidynodeCMIsEmpty(node), BVar7 != no)))) {
    AddChar(pprint_00,0x20);
    AddChar(pprint_00,0x2f);
  }
  AddChar(pprint_00,0x3e);
  if (((node->type == StartEndTag) && (iVar8 = prvTidyHTMLVersion(doc), iVar8 == 0x20000)) &&
     (BVar7 = prvTidynodeHasCM(node,0x400000), BVar7 == no)) {
    PPrintEndTag(doc,(uint)node,indent_00,(Node *)node_00);
  }
  uVar6 = local_44;
  if (node->type == StartEndTag && uVar4 == 0) {
    iVar8 = prvTidyHTMLVersion(doc);
    if ((uVar6 & 1) != 0 || iVar8 != 0x20000) {
      return;
    }
  }
  else if ((local_44 & 1) != 0) {
    return;
  }
  uVar2 = *(uint *)((doc->config).value + 0x5d);
  CheckWrapIndent(doc,indent);
  if ((doc->pprint).linelen + indent < uVar2) {
    if (((uVar6 & 8) == 0) &&
       ((BVar7 = prvTidynodeCMIsInline(node), BVar7 == no ||
        ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_BR)))))) {
      pLVar3 = doc->lexer;
      BVar7 = prvTidynodeCMIsEmpty(node);
      BVar7 = AfterSpaceImp(pLVar3,node,BVar7);
      if (BVar7 != no) {
        (doc->pprint).wraphere = (doc->pprint).linelen;
      }
    }
  }
  else {
    if (((uVar6 & 8) == 0) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_BR)))) {
      pLVar3 = doc->lexer;
      BVar7 = prvTidynodeCMIsEmpty(node);
      BVar7 = AfterSpaceImp(pLVar3,node,BVar7);
      if (BVar7 == no) {
        return;
      }
    }
    PCondFlushLineSmart(doc,indent);
  }
  return;
}

Assistant:

static void PPrintTag( TidyDocImpl* doc,
                       uint mode, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool uc = cfgBool( doc, TidyUpperCaseTags );
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    Bool xmlOut = cfgBool( doc, TidyXmlOut );
    tchar c;
    tmbstr s = node->element;

    AddChar( pprint, '<' );

    if ( node->type == EndTag )
        AddChar( pprint, '/' );

    if (s)
    {
        while (*s)
        {
            c = (unsigned char)*s;

            if (c > 0x7F)
                s += TY_(GetUTF8)(s, &c);
            else if (uc)
                c = TY_(ToUpper)(c);

            AddChar(pprint, c);
            ++s;
        }
    }

    PPrintAttrs( doc, indent, node );

    if ( (xmlOut || xhtmlOut) &&
         (node->type == StartEndTag || TY_(nodeCMIsEmpty)(node)) )
    {
        AddChar( pprint, ' ' );   /* Space is NS compatibility hack <br /> */
        AddChar( pprint, '/' );   /* Required end tag marker */
    }

    AddChar( pprint, '>' );

    /*\
     *  Appears this was added for Issue #111, #112, #113, but will now add an end tag
     *  for elements like <img ...> which do NOT have an EndTag, even in html5
     *  See Issue #162 - void elements also get a closing tag, like img, br, ...
     *  A complete list of the void elements in HTML.
     *  area, base, br, col, command, embed, hr, img, input, keygen, link, meta, param, source, track, wbr
     *  A new CM_VOID was added to tag_defs[] to account for these.
    \*/
    if ((node->type == StartEndTag && TY_(HTMLVersion)(doc) == HT50) && !TY_(nodeHasCM)(node, CM_VOID ) )
    {
        PPrintEndTag( doc, mode, indent, node );
    }

    if ( (node->type != StartEndTag || xhtmlOut || (node->type == StartEndTag && TY_(HTMLVersion)(doc) == HT50)) && !(mode & PREFORMATTED) )
    {
        uint wraplen = cfg( doc, TidyWrapLen );
        CheckWrapIndent( doc, indent );

        if ( indent + pprint->linelen < wraplen )
        {
            /* wrap after start tag if is <br/> or if it's not inline.
               Technically, it would be safe to call only AfterSpace.
               However, it would disrupt the existing algorithm. So let's
               leave as is. Note that AfterSpace returns true for non inline
               elements but can still be false for some <br>. So it has to
               stay as well. */
            if (!(mode & NOWRAP)
                && (!TY_(nodeCMIsInline)(node) || nodeIsBR(node))
                && AfterSpace(doc->lexer, node))
            {
                pprint->wraphere = pprint->linelen;
            }
        }
        /* flush the current buffer only if it is known to be safe,
           i.e. it will not introduce some spurious white spaces.
           See bug #996484 */
        else if ( mode & NOWRAP ||
                  nodeIsBR(node) || AfterSpace(doc->lexer, node))
            PCondFlushLineSmart( doc, indent );
    }
}